

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capability.c++
# Opt level: O3

void __thiscall
capnp::_::PipelineBuilderHook::PipelineBuilderHook(PipelineBuilderHook *this,uint firstSegmentWords)

{
  (this->super_Refcounted).refcount = 0;
  (this->super_PipelineHook)._vptr_PipelineHook = (_func_int **)&PTR_addRef_006cd8d0;
  (this->super_Refcounted).super_Disposer._vptr_Disposer = (_func_int **)&DAT_006cd908;
  MallocMessageBuilder::MallocMessageBuilder(&this->message,firstSegmentWords,GROW_HEURISTICALLY);
  MessageBuilder::getRootInternal(&this->root,&(this->message).super_MessageBuilder);
  return;
}

Assistant:

PipelineBuilderHook(uint firstSegmentWords)
      : message(firstSegmentWords),
        root(message.getRoot<AnyPointer>()) {}